

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSymm.c
# Opt level: O2

void Ntk_SymTryRandomFlips(word *pFun,word *pNpn,int nVars)

{
  int iVar1;
  word *pOut;
  long lVar2;
  
  iVar1 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    iVar1 = 1;
  }
  pOut = (word *)calloc((long)iVar1,8);
  Abc_TtCopy(pOut,pFun,iVar1,0);
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 4) {
    Abc_TtFlip(pOut,iVar1,*(int *)((long)&DAT_007ad8d0 + lVar2) % (nVars + -1));
  }
  iVar1 = Abc_TtCompareRev(pNpn,pOut,iVar1);
  if (iVar1 != 1) {
    free(pOut);
    return;
  }
  __assert_fail("Abc_TtCompareRev(pNpn, pFunT, nWords) != 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSymm.c"
                ,0x105,"void Ntk_SymTryRandomFlips(word *, word *, int)");
}

Assistant:

void Ntk_SymTryRandomFlips( word * pFun, word * pNpn, int nVars )
{
    int Rand[16] = { 17290, 20203, 19027, 12035, 14687, 10920, 10413, 261, 2072, 16899, 4480, 6192, 3978, 8343, 745, 1370 };
    int i, nWords = Abc_TtWordNum(nVars);
    word * pFunT = ABC_CALLOC( word, nWords );
    Abc_TtCopy( pFunT, pFun, nWords, 0 );
    for ( i = 0; i < 16; i++ )
        Abc_TtFlip( pFunT, nWords, Rand[i] % (nVars-1) );
    assert( Abc_TtCompareRev(pNpn, pFunT, nWords) != 1 );
    ABC_FREE( pFunT );
}